

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_inst.cpp
# Opt level: O3

spv_result_t
spvExtInstTableValueLookup
          (spv_ext_inst_table table,spv_ext_inst_type_t type,uint32_t value,
          spv_ext_inst_desc *pEntry)

{
  spv_ext_inst_group_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  spv_ext_inst_desc psVar4;
  
  if (table == (spv_ext_inst_table)0x0) {
    return SPV_ERROR_INVALID_TABLE;
  }
  if (pEntry != (spv_ext_inst_desc *)0x0) {
    if ((ulong)table->count != 0) {
      psVar1 = table->groups;
      uVar2 = 0;
      do {
        if (psVar1[uVar2].type == type) {
          uVar3 = (ulong)psVar1[uVar2].count;
          if (uVar3 != 0) {
            psVar4 = psVar1[uVar2].entries;
            do {
              if (psVar4->ext_inst == value) {
                *pEntry = psVar4;
                return SPV_SUCCESS;
              }
              psVar4 = psVar4 + 1;
              uVar3 = uVar3 - 1;
            } while (uVar3 != 0);
          }
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != table->count);
    }
    return SPV_ERROR_INVALID_LOOKUP;
  }
  return SPV_ERROR_INVALID_POINTER;
}

Assistant:

spv_result_t spvExtInstTableValueLookup(const spv_ext_inst_table table,
                                        const spv_ext_inst_type_t type,
                                        const uint32_t value,
                                        spv_ext_inst_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!pEntry) return SPV_ERROR_INVALID_POINTER;

  for (uint32_t groupIndex = 0; groupIndex < table->count; groupIndex++) {
    const auto& group = table->groups[groupIndex];
    if (type != group.type) continue;
    for (uint32_t index = 0; index < group.count; index++) {
      const auto& entry = group.entries[index];
      if (value == entry.ext_inst) {
        *pEntry = &entry;
        return SPV_SUCCESS;
      }
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}